

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strncat_63(UChar *dst,UChar *src,int32_t n)

{
  UChar UVar1;
  UChar *anchor;
  UChar *pUStack_20;
  int32_t n_local;
  UChar *src_local;
  UChar *dst_local;
  
  src_local = dst;
  if (0 < n) {
    for (; anchor._4_4_ = n, pUStack_20 = src, *src_local != L'\0'; src_local = src_local + 1) {
    }
    for (; UVar1 = *pUStack_20, *src_local = UVar1, UVar1 != L'\0'; pUStack_20 = pUStack_20 + 1) {
      src_local = src_local + 1;
      anchor._4_4_ = anchor._4_4_ + -1;
      if (anchor._4_4_ == 0) {
        *src_local = L'\0';
        return dst;
      }
    }
  }
  return dst;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_strncat(UChar     *dst, 
     const UChar     *src, 
     int32_t     n ) 
{
    if(n > 0) {
        UChar *anchor = dst;            /* save a pointer to start of dst */

        while(*dst != 0) {              /* To end of first string          */
            ++dst;
        }
        while((*dst = *src) != 0) {     /* copy string 2 over              */
            ++dst;
            if(--n == 0) {
                *dst = 0;
                break;
            }
            ++src;
        }

        return anchor;
    } else {
        return dst;
    }
}